

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,std::default_delete<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>>>,void>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,std::default_delete<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>>>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::default_delete<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>_>
          *alloc_ref)

{
  ulong uVar1;
  long lVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = this->old_capacity_;
  if (7 < uVar1) {
    __assert_fail("old_capacity_ < Group::kWidth / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x82e,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>>>, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (uVar1 < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (uVar1 != 0) {
        lVar2 = *(long *)((long)&c->heap_or_soo_ + 8);
        puVar3 = (undefined8 *)((long)(this->old_heap_or_soo_).heap.slot_array.p + 8);
        uVar4 = 0;
        do {
          if (kSentinel < (this->old_heap_or_soo_).heap.control[uVar4]) {
            lVar5 = (uVar4 ^ (uVar1 >> 1) + 1) * 0x10;
            *(undefined8 *)(lVar2 + lVar5) = puVar3[-1];
            *(undefined8 *)(lVar2 + 8 + lVar5) = *puVar3;
            *puVar3 = 0;
          }
          uVar4 = uVar4 + 1;
          puVar3 = puVar3 + 2;
        } while (uVar1 != uVar4);
      }
      return;
    }
    __assert_fail("!was_soo_",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7c2,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x82f,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>>>, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    assert(old_capacity_ < Group::kWidth / 2);
    assert(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    assert(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array());
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());

    size_t shuffle_bit = old_capacity_ / 2 + 1;
    for (size_t i = 0; i < old_capacity_; ++i) {
      if (IsFull(old_ctrl()[i])) {
        size_t new_i = i ^ shuffle_bit;
        SanitizerUnpoisonMemoryRegion(new_slots + new_i, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots + new_i,
                               old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }